

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::BitfieldReverseCase::BitfieldReverseCase
          (BitfieldReverseCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  shaderexecutor::(anonymous_namespace)::getIntegerFuncCaseName_abi_cxx11_
            (&local_68.name,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType
            );
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,testCtx,local_68.name._M_dataplus._M_p,
             "bitfieldReverse",shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_00be0898;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"value",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_IntegerFunctionCase).m_spec.inputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"result",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,PRECISION_HIGHP);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_IntegerFunctionCase).m_spec.outputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_IntegerFunctionCase).m_spec.source);
  return;
}

Assistant:

BitfieldReverseCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase	(testCtx, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "bitfieldReverse", shaderType)
	{
		m_spec.inputs.push_back(Symbol("value", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("result", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.source = "result = bitfieldReverse(value);";
	}